

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void funnelsort<32u,buffer_layout_bfs>(uchar **strings,size_t n,uchar **tmp)

{
  size_t sVar1;
  unsigned_long uVar2;
  int iVar3;
  uchar **ppuVar4;
  undefined8 *puVar5;
  long lVar6;
  undefined8 *puVar7;
  fill<32U,_2U,_buffer_layout_bfs> local_3829;
  uchar **local_3828;
  uchar **local_3820;
  size_t local_3818;
  array<unsigned_long,_32UL> buffer_count;
  array<Stream,_32UL> streams;
  array<unsigned_char_*,_1692UL> buffers;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,(size_t)tmp);
    return;
  }
  streams._M_elems[0].n = n >> 5;
  streams._M_elems[0].stream = strings;
  ppuVar4 = strings + streams._M_elems[0].n;
  for (lVar6 = 0x18; lVar6 != 0x1f8; lVar6 = lVar6 + 0x10) {
    *(uchar ***)((long)streams._M_elems + lVar6 + -8) = ppuVar4;
    *(size_t *)((long)&streams._M_elems[0].stream + lVar6) = streams._M_elems[0].n;
    ppuVar4 = ppuVar4 + streams._M_elems[0].n;
  }
  streams._M_elems[0x1f].stream = streams._M_elems[0x1e].stream + streams._M_elems[0].n;
  streams._M_elems[0x1f].n = streams._M_elems[0].n * -0x1f + n;
  local_3820 = strings;
  local_3818 = n;
  for (lVar6 = 8; lVar6 != 0x208; lVar6 = lVar6 + 0x10) {
    ppuVar4 = *(uchar ***)((long)streams._M_elems + lVar6 + -8);
    sVar1 = *(size_t *)((long)&streams._M_elems[0].stream + lVar6);
    funnelsort<8u,buffer_layout_bfs>(ppuVar4,sVar1,tmp);
    check_input(ppuVar4,sVar1);
  }
  buffers._M_elems[0] = (uchar *)0x0;
  std::array<unsigned_long,_32UL>::fill(&buffer_count,(value_type_conflict1 *)&buffers);
  local_3828 = tmp;
  while( true ) {
    if ((buffer_count._M_elems[2] == 0) &&
       (fill<32U,_2U,_buffer_layout_bfs>::operator()
                  (&local_3829,&streams,buffers._M_elems,&buffer_count),
       buffer_count._M_elems[2] == 0)) {
      if (buffer_count._M_elems[3] == 0) {
        __assert_fail("buffer_count[3] != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x239,
                      "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 32U, BufferLayout = buffer_layout_bfs]"
                     );
      }
      while (uVar2 = buffer_count._M_elems[3], buffer_count._M_elems[3] != 0) {
        if (buffer_count._M_elems[3] * 8 != 0) {
          memcpy(tmp,(void *)((long)&buffers + buffer_count._M_elems[3] * -8 + 0x80),
                 buffer_count._M_elems[3] * 8);
        }
        tmp = tmp + uVar2;
        buffer_count._M_elems[3] = 0;
        fill<32U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<32U,_3U,_buffer_layout_bfs> *)&local_3829,&streams,buffers._M_elems,
                   &buffer_count);
      }
      goto LAB_0012ac0b;
    }
    if ((buffer_count._M_elems[3] == 0) &&
       (fill<32U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<32U,_3U,_buffer_layout_bfs> *)&local_3829,&streams,buffers._M_elems,
                   &buffer_count), buffer_count._M_elems[3] == 0)) break;
    puVar5 = (undefined8 *)((long)&buffers + (8 - buffer_count._M_elems[2]) * 8);
    lVar6 = 8 - buffer_count._M_elems[3];
    iVar3 = cmp((void *)*puVar5,*(void **)((long)&buffers + lVar6 * 8 + 0x40));
    puVar7 = (undefined8 *)((long)&buffers + lVar6 * 8 + 0x40);
    if (iVar3 < 1) {
      puVar7 = puVar5;
    }
    buffer_count._M_elems[(ulong)(0 < iVar3) + 2] =
         buffer_count._M_elems[(ulong)(0 < iVar3) + 2] - 1;
    *tmp = (uchar *)*puVar7;
    tmp = tmp + 1;
  }
  if (buffer_count._M_elems[2] == 0) {
    __assert_fail("buffer_count[2] != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x247,
                  "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 32U, BufferLayout = buffer_layout_bfs]"
                 );
  }
  while (uVar2 = buffer_count._M_elems[2], buffer_count._M_elems[2] != 0) {
    memcpy(tmp,(void *)((long)&buffers + buffer_count._M_elems[2] * -8 + 0x40),
           buffer_count._M_elems[2] * 8);
    tmp = tmp + uVar2;
    buffer_count._M_elems[2] = 0;
    fill<32U,_2U,_buffer_layout_bfs>::operator()
              (&local_3829,&streams,buffers._M_elems,&buffer_count);
  }
LAB_0012ac0b:
  sVar1 = local_3818;
  ppuVar4 = local_3820;
  memcpy(local_3820,local_3828,local_3818 * 8);
  check_input(ppuVar4,sVar1);
  return;
}

Assistant:

static void
funnelsort(unsigned char** strings, size_t n, unsigned char** restrict tmp)
{
	debug() << __func__ << "(), n=" << n << "\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	size_t splitter = n/K;
	std::array<Stream, K> streams;
	streams[0].stream = strings;
	streams[0].n      = splitter;
	for (unsigned i=1; i < K-1; ++i) {
		streams[i].stream = streams[i-1].stream + splitter;
		streams[i].n = splitter;
	}
	streams[K-1].stream = streams[K-2].stream + splitter;
	streams[K-1].n      = n - (K-1)*splitter;
	for (unsigned i=0; i < K; ++i) {
		funnelsort<(K>16?K/4:K/2),BufferLayout>(streams[i].stream,
		                                        streams[i].n, tmp);
		check_input(streams[i].stream, streams[i].n);
	}
	std::array<unsigned char*, buffer_total_size<K>::value> buffers;
	std::array<size_t, K> buffer_count;
	buffer_count.fill(0);
	fill_root<K,BufferLayout>(streams,tmp,buffers.data(),buffer_count);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	check_input(strings, n);
}